

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O3

int extract(Options *param_1,string *name)

{
  undefined8 uVar1;
  pointer *__ptr;
  File file;
  array<char,_8192UL> buf;
  undefined1 local_20b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20a0;
  pointer local_2090;
  pointer local_2080;
  pointer local_2078;
  long local_2068;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_2060;
  undefined1 local_2018 [8192];
  
  lrit::File::File((File *)(local_20b8 + 8),name);
  lrit::File::getData((File *)local_20b8);
  uVar1 = local_20b8._0_8_;
  while ((*(byte *)(uVar1 + *(long *)(*(long *)uVar1 + -0x18) + 0x20) & 2) == 0) {
    std::istream::read((char *)uVar1,(long)local_2018);
    std::ostream::write((char *)&std::cout,(long)local_2018);
  }
  if ((long *)local_20b8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_20b8._0_8_ + 8))();
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_2060);
  if (local_2078 != (pointer)0x0) {
    operator_delete(local_2078,local_2068 - (long)local_2078);
  }
  if (local_2090 != (pointer)0x0) {
    operator_delete(local_2090,(long)local_2080 - (long)local_2090);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_20b8._8_8_ != &local_20a0) {
    operator_delete((void *)local_20b8._8_8_,local_20a0._0_8_ + 1);
  }
  return 0;
}

Assistant:

int extract(const Options&, const std::string& name) {
  auto file = lrit::File(name);

  // Streaming copy from file to standard out
  auto data = file.getData();
  auto& ifs = *data;
  auto& ofs = std::cout;
  std::array<char, 8192> buf;
  while (!ifs.eof()) {
    ifs.read(buf.data(), buf.size());
    ofs.write(buf.data(), ifs.gcount());
  }

  return 0;
}